

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlCatalogGetSGMLPublic(xmlHashTablePtr catal,xmlChar *pubID)

{
  xmlCatalogEntryPtr pxVar1;
  void *pvVar2;
  xmlCatalogEntryPtr local_38;
  xmlChar *normid;
  xmlCatalogEntryPtr entry;
  xmlChar *pubID_local;
  xmlHashTablePtr catal_local;
  
  if (catal == (xmlHashTablePtr)0x0) {
    catal_local = (xmlHashTablePtr)0x0;
  }
  else {
    pxVar1 = (xmlCatalogEntryPtr)xmlCatalogNormalizePublic(pubID);
    entry = (xmlCatalogEntryPtr)pubID;
    if (pxVar1 != (xmlCatalogEntryPtr)0x0) {
      local_38 = pxVar1;
      if (*(xmlChar *)&pxVar1->next == '\0') {
        local_38 = (xmlCatalogEntryPtr)0x0;
      }
      entry = local_38;
    }
    pvVar2 = xmlHashLookup(catal,(xmlChar *)entry);
    if (pvVar2 == (void *)0x0) {
      if (pxVar1 != (xmlCatalogEntryPtr)0x0) {
        (*xmlFree)(pxVar1);
      }
      catal_local = (xmlHashTablePtr)0x0;
    }
    else if (*(int *)((long)pvVar2 + 0x18) == 0xe) {
      if (pxVar1 != (xmlCatalogEntryPtr)0x0) {
        (*xmlFree)(pxVar1);
      }
      catal_local = *(xmlHashTablePtr *)((long)pvVar2 + 0x30);
    }
    else {
      if (pxVar1 != (xmlCatalogEntryPtr)0x0) {
        (*xmlFree)(pxVar1);
      }
      catal_local = (xmlHashTablePtr)0x0;
    }
  }
  return (xmlChar *)catal_local;
}

Assistant:

static const xmlChar *
xmlCatalogGetSGMLPublic(xmlHashTablePtr catal, const xmlChar *pubID) {
    xmlCatalogEntryPtr entry;
    xmlChar *normid;

    if (catal == NULL)
	return(NULL);

    normid = xmlCatalogNormalizePublic(pubID);
    if (normid != NULL)
        pubID = (*normid != 0 ? normid : NULL);

    entry = (xmlCatalogEntryPtr) xmlHashLookup(catal, pubID);
    if (entry == NULL) {
	if (normid != NULL)
	    xmlFree(normid);
	return(NULL);
    }
    if (entry->type == SGML_CATA_PUBLIC) {
	if (normid != NULL)
	    xmlFree(normid);
	return(entry->URL);
    }
    if (normid != NULL)
        xmlFree(normid);
    return(NULL);
}